

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds_list.c
# Opt level: O0

DS_STATUS ds_entry_append(DsListEntry **entryAdd,DsListEntry *in)

{
  DsListEntry *local_28;
  DsListEntry *entry;
  DsListEntry *in_local;
  DsListEntry **entryAdd_local;
  
  if ((entryAdd == (DsListEntry **)0x0) || (in == (DsListEntry *)0x0)) {
    entryAdd_local._4_4_ = DS_STATUS_NULL;
  }
  else {
    if (*entryAdd == (DsListEntry *)0x0) {
      *entryAdd = in;
    }
    else {
      for (local_28 = *entryAdd; local_28->next != (DsListEntry *)0x0; local_28 = local_28->next) {
      }
      local_28->next = in;
      in->next = (DsListEntry *)0x0;
      in->prev = local_28;
    }
    entryAdd_local._4_4_ = DS_STATUS_OK;
  }
  return entryAdd_local._4_4_;
}

Assistant:

static DS_STATUS ds_entry_append(DsListEntry **entryAdd, DsListEntry *in)
{
    if (NULL == entryAdd || NULL == in)
        return DS_STATUS_NULL;
    if (NULL == *entryAdd)
        *entryAdd = in;
    else
    {
        DsListEntry *entry = *entryAdd;
        while (entry->next)
            entry = entry->next;
        entry->next = in;
        in->next = NULL;
        in->prev = entry;
    }
    return DS_STATUS_OK;
}